

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.h
# Opt level: O0

void __thiscall
flow::AllocaInstr::AllocaInstr(AllocaInstr *this,LiteralType ty,Value *n,string *name)

{
  initializer_list<flow::Value_*> __l;
  allocator<flow::Value_*> local_59;
  Value *local_58;
  iterator local_50;
  size_type local_48;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> local_40;
  string *local_28;
  string *name_local;
  Value *n_local;
  AllocaInstr *pAStack_10;
  LiteralType ty_local;
  AllocaInstr *this_local;
  
  local_50 = &local_58;
  local_48 = 1;
  local_58 = n;
  local_28 = name;
  name_local = (string *)n;
  n_local._4_4_ = ty;
  pAStack_10 = this;
  std::allocator<flow::Value_*>::allocator(&local_59);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::vector(&local_40,__l,&local_59);
  Instr::Instr(&this->super_Instr,ty,&local_40,local_28);
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::~vector(&local_40);
  std::allocator<flow::Value_*>::~allocator(&local_59);
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)&PTR__AllocaInstr_002cb290;
  return;
}

Assistant:

AllocaInstr(LiteralType ty, Value* n, const std::string& name)
      : Instr(ty, {n}, name) {}